

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

CurrencyNameCacheEntry * getCacheEntry(char *locale,UErrorCode *ec)

{
  short sVar1;
  int8_t iVar2;
  CurrencyNameStruct *pCVar3;
  UBool UVar4;
  int iVar5;
  int32_t iVar6;
  int32_t iVar7;
  UErrorCode UVar8;
  UResourceBundle *pUVar9;
  UChar *pUVar10;
  UnicodeString *pUVar11;
  UResourceBundle *resB;
  CurrencyNameStruct *pCVar12;
  char *pcVar13;
  void *pvVar14;
  char16_t *pcVar15;
  CurrencyNameCacheEntry *pCVar16;
  int8_t i;
  CurrencyNameCacheEntry **ppCVar17;
  long lVar18;
  int iVar19;
  size_t __nmemb;
  size_t __nmemb_00;
  int32_t *piVar20;
  char cVar21;
  ulong uVar22;
  bool bVar23;
  UErrorCode ec2_1;
  Hashtable *local_298;
  UErrorCode ec2;
  ulong local_288;
  UResourceBundle *local_280;
  UResourceBundle *local_278;
  char *local_270;
  UErrorCode ec4;
  CurrencyNameStruct *local_260;
  CurrencyNameStruct *local_258;
  UErrorCode *local_250;
  UResourceBundle *local_248;
  ulong local_240;
  UHashtable *local_238;
  ConstChar16Ptr local_230;
  int local_228;
  int32_t len;
  UResourceBundle *local_220;
  Hashtable *local_218;
  UResourceBundle *local_210;
  UErrorCode ec3;
  UnicodeString *local_200;
  UnicodeString *local_1f8;
  ulong local_1f0;
  int32_t *local_1e8;
  int32_t *local_1e0;
  UChar *local_1d8;
  UChar *local_1c8;
  EquivIterator iter;
  char locale_1 [157];
  char loc [157];
  
  local_270 = locale;
  local_250 = ec;
  umtx_lock_63(&gCurrencyCacheMutex);
  ppCVar17 = currCache;
  pCVar16 = (CurrencyNameCacheEntry *)0x0;
  for (uVar22 = 0; uVar22 != 10; uVar22 = uVar22 + 1) {
    if ((*ppCVar17 != (CurrencyNameCacheEntry *)0x0) &&
       (iVar5 = strcmp(local_270,(*ppCVar17)->locale), iVar5 == 0)) {
      bVar23 = 9 < uVar22;
      pCVar16 = *ppCVar17;
      pCVar16->refCount = pCVar16->refCount + 1;
      goto LAB_002c0f28;
    }
    ppCVar17 = ppCVar17 + 1;
  }
  uVar22 = 0xff;
  bVar23 = true;
LAB_002c0f28:
  umtx_unlock_63(&gCurrencyCacheMutex);
  if (bVar23) {
    local_1f0 = uVar22;
    local_218 = getCurrSymbolsEquiv();
    ec2 = U_ZERO_ERROR;
    uloc_getName_63(local_270,loc,0x9d,&ec2);
    if (U_ZERO_ERROR < ec2 || ec2 == U_STRING_NOT_TERMINATED_WARNING) {
      *local_250 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    strcpy(locale_1,loc);
    local_298 = getCurrSymbolsEquiv();
    iVar19 = 0;
    iVar5 = 0;
    do {
      ec2_1 = U_ZERO_ERROR;
      local_280 = ures_open_63("icudt63l-curr",locale_1,&ec2_1);
      local_278 = ures_getByKey_63(local_280,"Currencies",(UResourceBundle *)0x0,&ec2_1);
      iVar6 = ures_getSize_63(local_278);
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      local_288 = CONCAT44(local_288._4_4_,iVar5 + iVar6);
      for (iVar5 = 0; iVar5 != iVar6; iVar5 = iVar5 + 1) {
        pUVar9 = ures_getByIndex_63(local_278,iVar5,(UResourceBundle *)0x0,&ec2_1);
        pUVar10 = ures_getStringByIndex_63(pUVar9,0,&len,&ec2_1);
        if (local_298 == (Hashtable *)0x0) {
          iVar19 = iVar19 + 1;
        }
        else {
          _ec4 = pUVar10;
          icu_63::UnicodeString::UnicodeString
                    ((UnicodeString *)&iter,'\x01',(ConstChar16Ptr *)&ec4,len);
          _ec3 = local_298;
          local_200 = (UnicodeString *)&iter;
          local_1f8 = (UnicodeString *)&iter;
          do {
            pUVar11 = icu_63::EquivIterator::next((EquivIterator *)&ec3);
            iVar19 = iVar19 + 1;
          } while (pUVar11 != (UnicodeString *)0x0);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&iter);
          local_1c8 = _ec4;
        }
        iVar19 = iVar19 + 1;
        ures_close_63(pUVar9);
      }
      iter._hash = (Hashtable *)((ulong)iter._hash & 0xffffffff00000000);
      pUVar9 = ures_getByKey_63(local_280,"CurrencyPlurals",(UResourceBundle *)0x0,
                                (UErrorCode *)&iter);
      iVar6 = ures_getSize_63(pUVar9);
      iVar5 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
        iVar5 = 0;
      }
      for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
        resB = ures_getByIndex_63(pUVar9,iVar5,(UResourceBundle *)0x0,(UErrorCode *)&iter);
        iVar7 = ures_getSize_63(resB);
        local_288 = CONCAT44(local_288._4_4_,(int)local_288 + iVar7);
        ures_close_63(resB);
      }
      ures_close_63(pUVar9);
      ures_close_63(local_278);
      ures_close_63(local_280);
      UVar4 = fallback(locale_1);
      iVar5 = (int)local_288;
    } while (UVar4 != '\0');
    pCVar12 = (CurrencyNameStruct *)uprv_malloc_63((long)(int)local_288 * 0x18);
    local_258 = (CurrencyNameStruct *)uprv_malloc_63((long)iVar19 * 0x18);
    if (*local_250 < U_ILLEGAL_ARGUMENT_ERROR) {
      _ec3 = (Hashtable *)((ulong)_ec3 & 0xffffffff00000000);
      _ec4 = _ec4 & 0xffffffff00000000;
      local_280 = (UResourceBundle *)
                  uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,&ec3);
      local_238 = uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,&ec4);
      local_1e8 = &local_258->flag;
      local_1e0 = &pCVar12->flag;
      local_298 = (Hashtable *)0x0;
      local_288 = 0;
      local_278 = (UResourceBundle *)((ulong)local_278 & 0xffffffff00000000);
      local_260 = pCVar12;
      do {
        ec2 = U_ZERO_ERROR;
        local_220 = ures_open_63("icudt63l-curr",loc,&ec2);
        local_210 = ures_getByKey_63(local_220,"Currencies",(UResourceBundle *)0x0,&ec2);
        iVar6 = ures_getSize_63(local_210);
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        local_248 = (UResourceBundle *)CONCAT44(local_248._4_4_,iVar6);
        iVar6 = 0;
        while( true ) {
          iVar5 = (int)local_288;
          __nmemb = (size_t)(int)local_288;
          if (iVar6 == (int)local_248) break;
          pUVar9 = ures_getByIndex_63(local_210,iVar6,(UResourceBundle *)0x0,&ec2);
          pUVar10 = ures_getStringByIndex_63(pUVar9,0,&ec2_1,&ec2);
          pcVar13 = ures_getKey_63(pUVar9);
          if (((int)local_278 == 0) ||
             (pvVar14 = uhash_get_63((UHashtable *)local_280,pcVar13), pvVar14 == (void *)0x0)) {
            uhash_put_63((UHashtable *)local_280,pcVar13,pcVar13,&ec3);
            local_258[__nmemb].flag = 0;
            iVar5 = iVar5 + 1;
            local_258[__nmemb].IsoCode = pcVar13;
            local_258[__nmemb].currencyName = pUVar10;
            local_258[__nmemb].currencyNameLen = ec2_1;
            local_240 = CONCAT44(local_240._4_4_,iVar6);
            if (local_218 != (Hashtable *)0x0) {
              local_230.p_ = pUVar10;
              icu_63::UnicodeString::UnicodeString
                        ((UnicodeString *)locale_1,'\x01',&local_230,ec2_1);
              local_1d8 = local_230.p_;
              iter._hash = local_218;
              piVar20 = local_1e8 + (long)iVar5 * 6;
              iter._start = (UnicodeString *)locale_1;
              iter._current = (UnicodeString *)locale_1;
              while (pUVar11 = icu_63::EquivIterator::next(&iter), pUVar11 != (UnicodeString *)0x0)
              {
                ((CurrencyNameStruct *)(piVar20 + -5))->IsoCode = pcVar13;
                pcVar15 = icu_63::UnicodeString::getBuffer(pUVar11);
                *(char16_t **)(piVar20 + -3) = pcVar15;
                *piVar20 = 0;
                sVar1 = (pUVar11->fUnion).fStackFields.fLengthAndFlags;
                if (sVar1 < 0) {
                  iVar6 = (pUVar11->fUnion).fFields.fLength;
                }
                else {
                  iVar6 = (int)sVar1 >> 5;
                }
                piVar20[-1] = iVar6;
                iVar5 = iVar5 + 1;
                piVar20 = piVar20 + 6;
              }
              icu_63::UnicodeString::~UnicodeString((UnicodeString *)locale_1);
            }
            pCVar3 = local_260;
            pUVar10 = ures_getStringByIndex_63(pUVar9,1,&ec2_1,&ec2);
            iVar19 = (int)local_298;
            pCVar3[iVar19].IsoCode = pcVar13;
            pUVar10 = toUpperCase(pUVar10,ec2_1,local_270);
            pCVar12 = local_258;
            pCVar3[iVar19].currencyName = pUVar10;
            pCVar3[iVar19].flag = 1;
            local_298 = (Hashtable *)(ulong)(iVar19 + 1);
            pCVar3[iVar19].currencyNameLen = ec2_1;
            local_258[iVar5].IsoCode = pcVar13;
            pUVar10 = (UChar *)uprv_malloc_63(6);
            pCVar12[iVar5].currencyName = pUVar10;
            u_charsToUChars_63(pcVar13,pUVar10,3);
            local_288 = (ulong)(iVar5 + 1);
            pCVar12 = pCVar12 + iVar5;
            pCVar12->currencyNameLen = 3;
            pCVar12->flag = 1;
            iVar6 = (int)local_240;
          }
          ures_close_63(pUVar9);
          iVar6 = iVar6 + 1;
        }
        locale_1[0] = '\0';
        locale_1[1] = '\0';
        locale_1[2] = '\0';
        locale_1[3] = '\0';
        uVar22 = 0;
        local_248 = ures_getByKey_63(local_220,"CurrencyPlurals",(UResourceBundle *)0x0,
                                     (UErrorCode *)locale_1);
        local_228 = ures_getSize_63(local_248);
        if (local_228 < 1) {
          local_228 = 0;
        }
        while( true ) {
          __nmemb_00 = (size_t)(int)local_298;
          if ((int)uVar22 == local_228) break;
          pUVar9 = ures_getByIndex_63(local_248,(int)uVar22,(UResourceBundle *)0x0,
                                      (UErrorCode *)locale_1);
          pcVar13 = ures_getKey_63(pUVar9);
          if (((int)local_278 == 0) ||
             (pvVar14 = uhash_get_63(local_238,pcVar13), pvVar14 == (void *)0x0)) {
            local_240 = uVar22;
            uhash_put_63(local_238,pcVar13,pcVar13,&ec4);
            iVar6 = ures_getSize_63(pUVar9);
            iVar5 = 0;
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            piVar20 = local_1e0 + __nmemb_00 * 6;
            for (; iVar6 != iVar5; iVar5 = iVar5 + 1) {
              pUVar10 = ures_getStringByIndex_63
                                  (pUVar9,iVar5,(int32_t *)&iter,(UErrorCode *)locale_1);
              ((CurrencyNameStruct *)(piVar20 + -5))->IsoCode = pcVar13;
              pUVar10 = toUpperCase(pUVar10,(int32_t)iter._hash,local_270);
              *(UChar **)(piVar20 + -3) = pUVar10;
              *piVar20 = 1;
              piVar20[-1] = (int32_t)iter._hash;
              piVar20 = piVar20 + 6;
            }
            local_298 = (Hashtable *)(ulong)(uint)((int)local_298 + iVar5);
            ures_close_63(pUVar9);
            uVar22 = local_240;
          }
          else {
            ures_close_63(pUVar9);
          }
          uVar22 = (ulong)((int)uVar22 + 1);
        }
        ures_close_63(local_248);
        ures_close_63(local_210);
        ures_close_63(local_220);
        UVar4 = fallback(loc);
        local_278 = (UResourceBundle *)CONCAT44(local_278._4_4_,(int)local_278 + 1);
      } while (UVar4 != '\0');
      uhash_close_63((UHashtable *)local_280);
      uhash_close_63(local_238);
      qsort(local_260,__nmemb_00,0x18,currencyNameComparator);
      qsort(local_258,__nmemb,0x18,currencyNameComparator);
      UVar8 = ec3;
      if ((ec3 < U_ILLEGAL_ARGUMENT_ERROR) && (UVar8 = ec4, ec4 < U_ILLEGAL_ARGUMENT_ERROR)) {
        if (*local_250 < U_ILLEGAL_ARGUMENT_ERROR) {
          umtx_lock_63(&gCurrencyCacheMutex);
          ppCVar17 = currCache;
          lVar18 = 0;
          cVar21 = (char)local_1f0;
          do {
            if (lVar18 == 10) {
LAB_002c171a:
              if (cVar21 == -1) {
                pCVar16 = currCache[(byte)currentCacheEntryIndex];
                if (pCVar16 != (CurrencyNameCacheEntry *)0x0) {
                  piVar20 = &pCVar16->refCount;
                  *piVar20 = *piVar20 + -1;
                  if (*piVar20 == 0) {
                    deleteCacheEntry(pCVar16);
                  }
                }
                pCVar16 = (CurrencyNameCacheEntry *)uprv_malloc_63(0xc0);
                iVar2 = currentCacheEntryIndex;
                currCache[(byte)currentCacheEntryIndex] = pCVar16;
                strcpy((char *)pCVar16,local_270);
                pCVar16->currencyNames = local_260;
                pCVar16->totalCurrencyNameCount = (int32_t)local_298;
                pCVar16->currencySymbols = local_258;
                pCVar16->totalCurrencySymbolCount = (int32_t)local_288;
                pCVar16->refCount = 2;
                currentCacheEntryIndex = (int8_t)(((byte)iVar2 + 1 & 0xff) % 10);
                ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
              }
              else {
                deleteCurrencyNames(local_260,(int32_t)local_298);
                deleteCurrencyNames(local_258,(int32_t)local_288);
                pCVar16 = currCache[cVar21];
                pCVar16->refCount = pCVar16->refCount + 1;
              }
              umtx_unlock_63(&gCurrencyCacheMutex);
              return pCVar16;
            }
            if ((*ppCVar17 != (CurrencyNameCacheEntry *)0x0) &&
               (iVar5 = strcmp(local_270,(*ppCVar17)->locale), iVar5 == 0)) {
              cVar21 = (char)lVar18;
              goto LAB_002c171a;
            }
            lVar18 = lVar18 + 1;
            ppCVar17 = ppCVar17 + 1;
          } while( true );
        }
      }
      else {
        *local_250 = UVar8;
      }
    }
    pCVar16 = (CurrencyNameCacheEntry *)0x0;
  }
  return pCVar16;
}

Assistant:

static CurrencyNameCacheEntry*
getCacheEntry(const char* locale, UErrorCode& ec) {

    int32_t total_currency_name_count = 0;
    CurrencyNameStruct* currencyNames = NULL;
    int32_t total_currency_symbol_count = 0;
    CurrencyNameStruct* currencySymbols = NULL;
    CurrencyNameCacheEntry* cacheEntry = NULL;

    umtx_lock(&gCurrencyCacheMutex);
    // in order to handle racing correctly,
    // not putting 'search' in a separate function.
    int8_t found = -1;
    for (int8_t i = 0; i < CURRENCY_NAME_CACHE_NUM; ++i) {
        if (currCache[i]!= NULL &&
            uprv_strcmp(locale, currCache[i]->locale) == 0) {
            found = i;
            break;
        }
    }
    if (found != -1) {
        cacheEntry = currCache[found];
        ++(cacheEntry->refCount);
    }
    umtx_unlock(&gCurrencyCacheMutex);
    if (found == -1) {
        collectCurrencyNames(locale, &currencyNames, &total_currency_name_count, &currencySymbols, &total_currency_symbol_count, ec);
        if (U_FAILURE(ec)) {
            return NULL;
        }
        umtx_lock(&gCurrencyCacheMutex);
        // check again.
        for (int8_t i = 0; i < CURRENCY_NAME_CACHE_NUM; ++i) {
            if (currCache[i]!= NULL &&
                uprv_strcmp(locale, currCache[i]->locale) == 0) {
                found = i;
                break;
            }
        }
        if (found == -1) {
            // insert new entry to 
            // currentCacheEntryIndex % CURRENCY_NAME_CACHE_NUM
            // and remove the existing entry 
            // currentCacheEntryIndex % CURRENCY_NAME_CACHE_NUM
            // from cache.
            cacheEntry = currCache[currentCacheEntryIndex];
            if (cacheEntry) {
                --(cacheEntry->refCount);
                // delete if the ref count is zero
                if (cacheEntry->refCount == 0) {
                    deleteCacheEntry(cacheEntry);
                }
            }
            cacheEntry = (CurrencyNameCacheEntry*)uprv_malloc(sizeof(CurrencyNameCacheEntry));
            currCache[currentCacheEntryIndex] = cacheEntry;
            uprv_strcpy(cacheEntry->locale, locale);
            cacheEntry->currencyNames = currencyNames;
            cacheEntry->totalCurrencyNameCount = total_currency_name_count;
            cacheEntry->currencySymbols = currencySymbols;
            cacheEntry->totalCurrencySymbolCount = total_currency_symbol_count;
            cacheEntry->refCount = 2; // one for cache, one for reference
            currentCacheEntryIndex = (currentCacheEntryIndex + 1) % CURRENCY_NAME_CACHE_NUM;
            ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
        } else {
            deleteCurrencyNames(currencyNames, total_currency_name_count);
            deleteCurrencyNames(currencySymbols, total_currency_symbol_count);
            cacheEntry = currCache[found];
            ++(cacheEntry->refCount);
        }
        umtx_unlock(&gCurrencyCacheMutex);
    }

    return cacheEntry;
}